

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * calculate_global_layer_weights(void)

{
  pointer pdVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  vector<double,_std::allocator<double>_> *in_RDI;
  long lVar6;
  ulong uVar7;
  vector<double,_std::allocator<double>_> weights;
  allocator_type local_69;
  undefined1 local_68 [16];
  pointer local_58;
  vector<double,_std::allocator<double>_> local_50;
  pointer local_38;
  pointer pdStack_30;
  
  spatial_region::calculate_layer_weights
            (&local_50,
             (spatial_region *)
             psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
             _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,balancing_particle_weight);
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar6 = (long)mpi_rank;
  if (lVar6 == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_68,(long)nx_global,&local_69);
    (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_58;
    pdVar1 = (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = (pointer)local_68._0_8_;
    pdStack_30 = (pointer)local_68._8_8_;
    (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_68._0_8_;
    (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_68._8_8_;
    local_68 = ZEXT816(0) << 0x20;
    local_58 = (pointer)0x0;
    if (pdVar1 != (pointer)0x0) {
      operator_delete(pdVar1);
    }
    if ((pointer)local_68._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_68._0_8_);
    }
    pdVar1 = local_38;
    uVar3 = *nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (0 < n_sr) {
      uVar3 = uVar3 - nx_ich / 2;
    }
    if (0 < (int)uVar3) {
      uVar4 = 0;
      do {
        local_38[uVar4] =
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    uVar4 = (ulong)(uint)n_sr;
    if (1 < n_sr) {
      uVar7 = 1;
      do {
        iVar2 = nx_ich / 2;
        iVar5 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar7];
        if (uVar7 != (int)uVar4 - 1) {
          iVar5 = iVar5 - iVar2;
        }
        MPI_Recv(pdVar1 + (long)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar7] + (long)iVar2,iVar5 - iVar2,
                 &ompi_mpi_double,uVar7 & 0xffffffff,uVar7 & 0xffffffff,&ompi_mpi_comm_world,0);
        uVar7 = uVar7 + 1;
        uVar4 = (ulong)n_sr;
      } while ((long)uVar7 < (long)uVar4);
    }
  }
  else {
    iVar2 = nx_ich / 2;
    iVar5 = nx_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    if (mpi_rank != n_sr + -1) {
      iVar5 = iVar5 - iVar2;
    }
    MPI_Send(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + iVar2,iVar5 - iVar2,&ompi_mpi_double,0,lVar6,
             &ompi_mpi_comm_world);
  }
  if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

vector<double> calculate_global_layer_weights() {
    auto weights = psr->calculate_layer_weights(balancing_particle_weight);

    vector<double> global_weights;

    if (mpi_rank == 0) {
        global_weights = vector<double>(nx_global);

        int left = 0;
        int right = ((n_sr > 0) ? nx_sr[0] - nx_ich / 2 : nx_sr[0]);

        for (int i = left; i < right; i++) {
            global_weights[i] = weights[i];
        }

        for (int n = 1; n < n_sr; n++) {
            left = nx_ich / 2;
            right = (n == n_sr-1 ? nx_sr[n] : nx_sr[n] - nx_ich / 2);
            MPI_Recv(&(global_weights[x0_sr[n] + left]), right-left, MPI_DOUBLE, n, n, MPI_COMM_WORLD, MPI_STATUS_IGNORE);
        }
    } else {
        int left = nx_ich / 2;
        int right = (mpi_rank == n_sr-1 ? nx_sr[mpi_rank] : nx_sr[mpi_rank] - nx_ich / 2);
        MPI_Send(&(weights[left]), right - left, MPI_DOUBLE, 0, mpi_rank, MPI_COMM_WORLD);
    }

    return global_weights;
}